

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  LogSeverity severity;
  Logger *pLVar1;
  bool bVar2;
  unsigned_long *puVar3;
  time_point *ptVar4;
  pointer pLVar5;
  size_t __n;
  char *tag;
  char *message;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *local_88;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *log_destination;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *__end3;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *__begin3;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> (*__range3) [4];
  size_t local_60;
  size_t copy;
  char w [66];
  LogMessage *this_local;
  
  unique0x1000062a = this;
  if ((this->data_->num_chars_to_log_ == 0) ||
     (this->data_->message_text_[this->data_->num_chars_to_log_ - 1] != '\n')) {
    RawLog__(FATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
             ,0x6d4,"Check %s failed: %s",
             "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
             ,"");
  }
  if (((SendToLog::already_warned_before_initgoogle & 1U) == 0) &&
     (bVar2 = IsGoogleLoggingInitialized(), !bVar2)) {
    memcpy(&copy,"WARNING: Logging before InitGoogleLogging() is written to STDERR\n",0x42);
    WriteToStderr((char *)&copy,0x41);
    SendToLog::already_warned_before_initgoogle = true;
  }
  if ((((fLB::FLAGS_logtostderr & 1) == 0) && ((fLB::FLAGS_logtostdout & 1) == 0)) &&
     (bVar2 = IsGoogleLoggingInitialized(), bVar2)) {
    severity = this->data_->severity_;
    ptVar4 = LogMessageTime::when(&this->time_);
    LogDestination::LogToAllLogfiles
              (severity,ptVar4,this->data_->message_text_,this->data_->num_chars_to_log_);
    LogDestination::MaybeLogToStderr
              (this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_,
               this->data_->num_prefix_chars_);
    LogDestination::MaybeLogToEmail
              (this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_);
    LogDestination::LogToSinks
              (this->data_->severity_,this->data_->fullname_,this->data_->basename_,
               this->data_->line_,&this->time_,
               this->data_->message_text_ + this->data_->num_prefix_chars_,
               (this->data_->num_chars_to_log_ - this->data_->num_prefix_chars_) - 1);
  }
  else {
    if ((fLB::FLAGS_logtostdout & 1) == 0) {
      ColoredWriteToStderr
                (this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_);
    }
    else {
      ColoredWriteToStdout
                (this->data_->severity_,this->data_->message_text_,this->data_->num_chars_to_log_);
    }
    LogDestination::LogToSinks
              (this->data_->severity_,this->data_->fullname_,this->data_->basename_,
               this->data_->line_,&this->time_,
               this->data_->message_text_ + this->data_->num_prefix_chars_,
               (this->data_->num_chars_to_log_ - this->data_->num_prefix_chars_) - 1);
  }
  if ((this->data_->severity_ == FATAL) && ((exit_on_dfatal & 1) != 0)) {
    if ((this->data_->first_fatal_ & 1U) != 0) {
      RecordCrashReason(this,(CrashReason *)crash_reason);
      glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      __range3 = (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                  (*) [4])0xff;
      puVar3 = std::min<unsigned_long>(&this->data_->num_chars_to_log_,(unsigned_long *)&__range3);
      local_60 = *puVar3;
      memcpy(&fatal_message,this->data_->message_text_,local_60);
      (&fatal_message)[local_60] = 0;
      ptVar4 = LogMessageTime::when(&this->time_);
      fatal_time = (ptVar4->__d).__r;
    }
    if (((fLB::FLAGS_logtostderr & 1) == 0) && ((fLB::FLAGS_logtostdout & 1) == 0)) {
      __begin3 = (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *
                 )LogDestination::log_destinations_;
      log_destination =
           (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
           (anonymous_namespace)::g_application_fingerprint_abi_cxx11_;
      for (__end3 = (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                     *)LogDestination::log_destinations_; __end3 != log_destination;
          __end3 = __end3 + 1) {
        local_88 = __end3;
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)__end3);
        if (bVar2) {
          pLVar5 = std::
                   unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                   ::operator->(local_88);
          pLVar1 = pLVar5->logger_;
          std::chrono::
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&message);
          (*pLVar1->_vptr_Logger[3])(pLVar1,1,&message,"",0);
        }
      }
    }
    std::mutex::unlock((mutex *)log_mutex);
    LogDestination::WaitForSinks(this->data_);
    __n = strlen("*** Check failure stack trace: ***\n");
    write(2,"*** Check failure stack trace: ***\n",__n);
    tag = glog_internal_namespace_::ProgramInvocationShortName();
    glog_internal_namespace_::AlsoErrorWrite(FATAL,tag,"*** Check failure stack trace: ***\n");
    Fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                 data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
             "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] =
        "WARNING: Logging before InitGoogleLogging() is "
        "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || FLAGS_logtostdout || !IsGoogleLoggingInitialized()) {
    if (FLAGS_logtostdout) {
      ColoredWriteToStdout(data_->severity_, data_->message_text_,
                           data_->num_chars_to_log_);
    } else {
      ColoredWriteToStderr(data_->severity_, data_->message_text_,
                           data_->num_chars_to_log_);
    }

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(
        data_->severity_, data_->fullname_, data_->basename_, data_->line_,
        time_, data_->message_text_ + data_->num_prefix_chars_,
        (data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1));
  } else {
    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, time_.when(),
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_,
                                     data_->num_prefix_chars_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(
        data_->severity_, data_->fullname_, data_->basename_, data_->line_,
        time_, data_->message_text_ + data_->num_prefix_chars_,
        (data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1));
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const size_t copy =
          min(data_->num_chars_to_log_, sizeof(fatal_message) - 1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = time_.when();
    }

    if (!FLAGS_logtostderr && !FLAGS_logtostdout) {
      for (auto& log_destination : LogDestination::log_destinations_) {
        if (log_destination) {
          log_destination->logger_->Write(
              true, std::chrono::system_clock::time_point{}, "", 0);
        }
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    AlsoErrorWrite(GLOG_FATAL,
                   glog_internal_namespace_::ProgramInvocationShortName(),
                   message);
    Fail();
  }
}